

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb.c
# Opt level: O1

CB_COEFF_BUFFER * av1_get_cb_coeff_buffer(AV1_COMP *cpi,int mi_row,int mi_col)

{
  byte bVar1;
  
  bVar1 = (byte)((cpi->common).seq_params)->mib_size_log2;
  return cpi->coeff_buffer_base +
         ((mi_col >> (bVar1 & 0x1f)) +
         (mi_row >> (bVar1 & 0x1f)) *
         (~(-1 << (bVar1 & 0x1f)) + (cpi->common).mi_params.mi_cols >> (bVar1 & 0x1f)));
}

Assistant:

CB_COEFF_BUFFER *av1_get_cb_coeff_buffer(const struct AV1_COMP *cpi, int mi_row,
                                         int mi_col) {
  const AV1_COMMON *const cm = &cpi->common;
  const int mib_size_log2 = cm->seq_params->mib_size_log2;
  const int stride =
      CEIL_POWER_OF_TWO(cm->mi_params.mi_cols, cm->seq_params->mib_size_log2);
  const int offset =
      (mi_row >> mib_size_log2) * stride + (mi_col >> mib_size_log2);
  return cpi->coeff_buffer_base + offset;
}